

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_function::dump(statement_function *this,ostream *o)

{
  pointer pbVar1;
  _Elt_pointer ppsVar2;
  ostream *poVar3;
  char *pcVar4;
  _Map_pointer pppsVar5;
  _Elt_pointer ppsVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer pbVar7;
  _Elt_pointer ppsVar8;
  
  poVar3 = std::operator<<(o,"< BeginFunction: ID = \"");
  poVar3 = std::operator<<(poVar3,(string *)&this->mName);
  std::operator<<(poVar3,"\"");
  pcVar4 = ", Override = False >\n";
  if (this->mOverride != false) {
    pcVar4 = ", Override = True >\n";
  }
  std::operator<<(o,pcVar4);
  std::operator<<(o,"< FunctionArgs = {");
  pbVar1 = (this->mArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (this->mArgs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    poVar3 = std::operator<<(o,"< ID = \"");
    poVar3 = std::operator<<(poVar3,(string *)pbVar7);
    std::operator<<(poVar3,"\" >");
  }
  std::operator<<(o,"} >\n< Body >\n");
  ppsVar8 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar6 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar5 = (this->mBlock).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar2 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar8 != ppsVar2) {
    (*(*ppsVar8)->_vptr_statement_base[5])(*ppsVar8,o);
    ppsVar8 = ppsVar8 + 1;
    if (ppsVar8 == ppsVar6) {
      ppsVar8 = pppsVar5[1];
      pppsVar5 = pppsVar5 + 1;
      ppsVar6 = ppsVar8 + 0x40;
    }
  }
  std::operator<<(o,"< EndFunction >\n");
  return;
}

Assistant:

void statement_function::dump(std::ostream &o) const
	{
		o << "< BeginFunction: ID = \"" << mName << "\"";
		if (mOverride)
			o << ", Override = True >\n";
		else
			o << ", Override = False >\n";
		o << "< FunctionArgs = {";
		for (auto &name: mArgs)
			o << "< ID = \"" << name << "\" >";
		o << "} >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndFunction >\n";
	}